

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderProgramResourceTest::iterate(GeometryShaderProgramResourceTest *this)

{
  GLint aGVar1 [1];
  GLint aGVar2 [1];
  TestLog *pTVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *description;
  bool bVar19;
  bool bVar20;
  GLenum local_1bc;
  GLenum props [1];
  GLint params [1];
  GLint params_1 [1];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long lVar18;
  
  initTest(this);
  bVar4 = checkIfResourceIsReferenced
                    (this,this->m_program_object_id,0x92e1,"uni_model_view_projection");
  bVar5 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e1,"uni_colors_white");
  bVar6 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e2,"Matrices");
  bVar7 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e2,"Colors");
  bVar20 = true;
  if (this->m_ssbos_supported == true) {
    bVar8 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e6,"Positions");
    bVar9 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e6,"Ids");
    bVar10 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e5,"Positions.position")
    ;
    bVar11 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e5,"Ids.ids");
    bVar8 = !bVar8;
    bVar10 = !bVar10;
  }
  else {
    bVar9 = false;
    bVar8 = true;
    bVar10 = true;
    bVar11 = false;
  }
  bVar12 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e3,"vs_in_position");
  bVar13 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e3,"vs_in_color");
  bVar14 = checkIfResourceIsReferenced(this,this->m_program_object_id,0x92e4,"fs_out_color");
  bVar19 = false;
  if (this->m_atomic_counters_supported == true) {
    iVar15 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    pTVar3 = _params_1;
    lVar18 = CONCAT44(extraout_var,iVar15);
    uVar16 = (**(code **)(lVar18 + 0x9a8))(this->m_program_object_id,0x92e1,"uni_atom_horizontal");
    uVar17 = (**(code **)(lVar18 + 0x9a8))(this->m_program_object_id,0x92e1,"uni_atom_vertical");
    params[0] = 0;
    props[0] = 0x9301;
    (**(code **)(lVar18 + 0x9c8))(this->m_program_object_id,0x92e1,uVar16,1,props,1,0,params);
    aGVar1[0] = params[0];
    (**(code **)(lVar18 + 0x9c8))(this->m_program_object_id,0x92e1,uVar17,1,props,1,0,params);
    aGVar2[0] = params[0];
    iVar15 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    params_1[0] = 0;
    local_1bc = (this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_GEOMETRY_SHADER;
    (**(code **)(CONCAT44(extraout_var_00,iVar15) + 0x9c8))
              (this->m_program_object_id,0x92c0,aGVar1[0],1,&local_1bc,1,0,params_1);
    bVar19 = params_1[0] == 1;
    iVar15 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    _params_1 = (TestLog *)((ulong)pTVar3 & 0xffffffff00000000);
    local_1bc = (this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_GEOMETRY_SHADER;
    (**(code **)(CONCAT44(extraout_var_01,iVar15) + 0x9c8))
              (this->m_program_object_id,0x92c0,aGVar2[0],1,&local_1bc,1,0,params_1);
    bVar20 = params_1[0] != 1;
  }
  if (!bVar5) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM",0x4b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (!bVar7) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  bVar7 = bVar7 && bVar5;
  if ((bVar20) && (this->m_atomic_counters_supported == true)) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
               ,0x59);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if ((bVar19) && (this->m_atomic_counters_supported == true)) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
               ,0x59);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if ((bVar8) && (this->m_ssbos_supported == true)) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
               ,0x58);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if ((bVar9 != false) && (this->m_ssbos_supported == true)) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
               ,0x58);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if ((bVar10) && (this->m_ssbos_supported == true)) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
               ,0x53);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if ((bVar11 != false) && (this->m_ssbos_supported == true)) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
               ,0x53);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if (bVar4) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM",0x4b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if (bVar6) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if (bVar12) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if (bVar13) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if (bVar14) {
    _params_1 = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_OUTPUT",
               0x52);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)params_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar7 = false;
  }
  if (!bVar7) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar7,
             description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderProgramResourceTest::iterate()
{
	initTest();

	/* Results */
	bool result = true;

	/* Results of checks, names come from shaders */
	bool is_gl_fs_out_color_program_output_referenced		  = false;
	bool is_ids_ids_buffer_variable_referenced				  = false;
	bool is_positions_position_buffer_variable_referenced	 = false;
	bool is_storage_ids_shader_storage_block_referenced		  = false;
	bool is_storage_positions_shader_storage_block_referenced = false;
	bool is_uni_atom_horizontal_uniform_referenced			  = false;
	bool is_uni_atom_vertical_uniform_referenced			  = false;
	bool is_uni_colors_uniform_referenced					  = false;
	bool is_uni_colors_white_uniform_referenced				  = false;
	bool is_uni_matrices_uniform_referenced					  = false;
	bool is_uni_model_view_projection_uniform_referenced	  = false;
	bool is_vs_in_color_program_input_referenced			  = false;
	bool is_vs_in_position_program_input_referenced			  = false;

	/* Check whether uniform variables are referenced */
	is_uni_model_view_projection_uniform_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM, "uni_model_view_projection");
	is_uni_colors_white_uniform_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM, "uni_colors_white");

	/* For: uniform Matrices {} uni_matrices; uniform block name is: Matrices */
	is_uni_matrices_uniform_referenced = checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM_BLOCK, "Matrices");
	is_uni_colors_uniform_referenced   = checkIfResourceIsReferenced(m_program_object_id, GL_UNIFORM_BLOCK, "Colors");

	/* For: buffer Positions {} storage_positions; storage block name is: Positions */
	if (m_ssbos_supported)
	{
		is_storage_positions_shader_storage_block_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_SHADER_STORAGE_BLOCK, "Positions");
		is_storage_ids_shader_storage_block_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_SHADER_STORAGE_BLOCK, "Ids");

		is_positions_position_buffer_variable_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_BUFFER_VARIABLE, "Positions.position");
		is_ids_ids_buffer_variable_referenced =
			checkIfResourceIsReferenced(m_program_object_id, GL_BUFFER_VARIABLE, "Ids.ids");
	}

	/* Check whether input attributes are referenced */
	is_vs_in_position_program_input_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_PROGRAM_INPUT, "vs_in_position");
	is_vs_in_color_program_input_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_PROGRAM_INPUT, "vs_in_color");

	/* Check whether output attributes are referenced */
	is_gl_fs_out_color_program_output_referenced =
		checkIfResourceIsReferenced(m_program_object_id, GL_PROGRAM_OUTPUT, "fs_out_color");

	/*
	 *     For the ATOMIC_COUNTER_BUFFER interface, the list of active buffer binding
	 *     points is built by identifying each unique binding point associated with
	 *     one or more active atomic counter uniform variables.  Active atomic
	 *     counter buffers do not have an associated name string.
	 */
	if (m_atomic_counters_supported)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		/* First get corresponding uniform indices */
		glw::GLuint atom_horizontal_uniform_indx =
			gl.getProgramResourceIndex(m_program_object_id, GL_UNIFORM, "uni_atom_horizontal");
		glw::GLuint atom_vertical_uniform_indx =
			gl.getProgramResourceIndex(m_program_object_id, GL_UNIFORM, "uni_atom_vertical");

		/* Then get atomic buffer indices */
		glw::GLuint atom_horizontal_uniform_buffer_indx = GL_INVALID_INDEX;
		glw::GLuint atom_vertical_uniform_buffer_indx   = GL_INVALID_INDEX;

		/* Data for getProgramResourceiv */
		glw::GLint  params[] = { 0 };
		glw::GLenum props[]  = { GL_ATOMIC_COUNTER_BUFFER_INDEX };

		/* Get property value */
		gl.getProgramResourceiv(m_program_object_id, GL_UNIFORM, atom_horizontal_uniform_indx, 1, /* propCount */
								props, 1,														  /* bufSize */
								0,																  /* length */
								params);
		atom_horizontal_uniform_buffer_indx = params[0];

		gl.getProgramResourceiv(m_program_object_id, GL_UNIFORM, atom_vertical_uniform_indx, 1, /* propCount */
								props, 1,														/* bufSize */
								0,																/* length */
								params);
		atom_vertical_uniform_buffer_indx = params[0];

		/* Check whether atomic counters are referenced using the atomic buffer indices */
		is_uni_atom_horizontal_uniform_referenced = checkIfResourceAtIndexIsReferenced(
			m_program_object_id, GL_ATOMIC_COUNTER_BUFFER, atom_horizontal_uniform_buffer_indx);
		is_uni_atom_vertical_uniform_referenced = checkIfResourceAtIndexIsReferenced(
			m_program_object_id, GL_ATOMIC_COUNTER_BUFFER, atom_vertical_uniform_buffer_indx);
	}

	/* Verify results: referenced properties */
	if (true != is_uni_colors_white_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_uni_colors_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_uni_atom_vertical_uniform_referenced && m_atomic_counters_supported)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
			<< tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_uni_atom_horizontal_uniform_referenced && m_atomic_counters_supported)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_ATOMIC_COUNTER_BUFFER"
			<< tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_storage_positions_shader_storage_block_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_storage_ids_shader_storage_block_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_SHADER_STORAGE_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (true != is_positions_position_buffer_variable_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_ids_ids_buffer_variable_referenced && m_ssbos_supported)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_BUFFER_VARIABLE"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Verify results: properties that are not referenced */
	if (false != is_uni_model_view_projection_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_uni_matrices_uniform_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_UNIFORM_BLOCK"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_vs_in_position_program_input_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_vs_in_color_program_input_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_INPUT"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (false != is_gl_fs_out_color_program_output_referenced)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Wrong value of property GL_REFERENCED_BY_GEOMETRY_SHADER_EXT for GL_PROGRAM_OUTPUT"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Set test result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return STOP;
}